

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall re2::Prog::Inst::Dump_abi_cxx11_(string *__return_storage_ptr__,Inst *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  
  uVar6 = this->out_opcode_;
  switch(uVar6 & 7) {
  case 0:
    uVar3 = (this->field_1).out1_;
    pcVar7 = "alt -> %d | %d";
    break;
  case 1:
    uVar3 = (this->field_1).out1_;
    pcVar7 = "altmatch -> %d | %d";
    break;
  case 2:
    iVar4 = foldcase(this);
    pcVar7 = "/i";
    if (iVar4 == 0) {
      pcVar7 = "";
    }
    bVar1 = (this->field_1).field_3.lo_;
    bVar2 = (this->field_1).field_3.hi_;
    uVar6 = hint(this);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"byte%s [%02x-%02x] %d -> %d",pcVar7,(ulong)bVar1,(ulong)bVar2
               ,(ulong)uVar6,this->out_opcode_ >> 4);
    return __return_storage_ptr__;
  case 3:
    uVar5 = (this->field_1).out1_;
    pcVar7 = "capture %d -> %d";
    goto LAB_001f2181;
  case 4:
    uVar5 = (this->field_1).out1_;
    pcVar7 = "emptywidth %#x -> %d";
LAB_001f2181:
    uVar3 = uVar6 >> 4;
    goto LAB_001f21ae;
  case 5:
    uVar6 = match_id(this);
    pcVar7 = "match! %d";
    goto LAB_001f21d2;
  case 6:
    uVar6 = uVar6 >> 4;
    pcVar7 = "nop -> %d";
LAB_001f21d2:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar7,(ulong)uVar6);
    return __return_storage_ptr__;
  case 7:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"fail");
    return __return_storage_ptr__;
  }
  uVar5 = uVar6 >> 4;
LAB_001f21ae:
  StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar7,(ulong)uVar5,(ulong)uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] %d -> %d",
                          foldcase() ? "/i" : "",
                          lo_, hi_, hint(), out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}